

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::DepthStencilModeCase::DepthStencilModeCase
          (DepthStencilModeCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *desc,GLenum target,TesterType tester,QueryType type)

{
  GLenum target_local;
  char *desc_local;
  char *name_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  DepthStencilModeCase *this_local;
  
  TextureTest::TextureTest(&this->super_TextureTest,testCtx,renderCtx,name,desc,target,tester,type);
  (this->super_TextureTest).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DepthStencilModeCase_015ca8e0;
  return;
}

Assistant:

DepthStencilModeCase::DepthStencilModeCase (tcu::TestContext& testCtx, const glu::RenderContext& renderCtx, const char* name, const char* desc, glw::GLenum target, TesterType tester, QueryType type)
	: TextureTest(testCtx, renderCtx, name, desc, target, tester, type)
{
}